

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Minefield_Data_PDU::operator==(Minefield_Data_PDU *this,Minefield_Data_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if ((((((!KVar1) &&
         (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar1))
        && ((this->m_SeqNumUnion).m_ui16SeqNum == (Value->m_SeqNumUnion).m_ui16SeqNum)) &&
       ((this->m_ui8ReqID == Value->m_ui8ReqID && (this->m_ui8PduSeqNum == Value->m_ui8PduSeqNum))))
      && ((this->m_ui8NumPdus == Value->m_ui8NumPdus &&
          ((this->m_ui8NumMines == Value->m_ui8NumMines &&
           (this->m_ui8NumSensTyp == Value->m_ui8NumSensTyp)))))) &&
     ((KVar1 = DATA_TYPE::MinefieldDataFilter::operator!=(&this->m_DataFilter,&Value->m_DataFilter),
      !KVar1 && ((KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MineTyp,&Value->m_MineTyp),
                 !KVar1 && (bVar2 = std::operator!=(&this->m_vui16SensorTypes,
                                                    &Value->m_vui16SensorTypes), !bVar2)))))) {
    bVar2 = std::operator!=(&this->m_vMines,&Value->m_vMines);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Minefield_Data_PDU::operator == ( const Minefield_Data_PDU & Value ) const
{
    if( Minefield_Header::operator  != ( Value ) )                          return false;
    if( m_ReqID                     != Value.m_ReqID )                      return false;
    if( m_SeqNumUnion.m_ui16SeqNum  != Value.m_SeqNumUnion.m_ui16SeqNum )   return false;
    if( m_ui8ReqID                  != Value.m_ui8ReqID )                   return false;
    if( m_ui8PduSeqNum              != Value.m_ui8PduSeqNum )               return false;
    if( m_ui8NumPdus                != Value.m_ui8NumPdus )                 return false;
    if( m_ui8NumMines               != Value.m_ui8NumMines )                return false;
    if( m_ui8NumSensTyp             != Value.m_ui8NumSensTyp )              return false;
    if( m_DataFilter                != Value.m_DataFilter )                 return false;
    if( m_MineTyp                   != Value.m_MineTyp )                    return false;
    if( m_vui16SensorTypes          != Value.m_vui16SensorTypes )           return false;
    if( m_vMines                    != Value.m_vMines )                     return false;
    return true;
}